

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_linux.c
# Opt level: O1

int platform_init(void)

{
  HTTPAPIEX_RESULT HVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  
  HVar1 = HTTPAPIEX_Init();
  iVar2 = 0;
  if (HVar1 == HTTPAPIEX_ERROR) {
    p_Var3 = xlogging_get_log_function();
    iVar2 = 0x28;
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/platform_linux.c"
                ,"platform_init",0x27,1,"HTTP for upload to blob failed on initialization.");
    }
  }
  if (HVar1 == HTTPAPIEX_ERROR) {
    return iVar2;
  }
  iVar2 = tlsio_openssl_init();
  return iVar2;
}

Assistant:

int platform_init(void)
{
    int result = 0;
#ifdef USE_HTTP
#ifndef DONT_USE_UPLOADTOBLOB
    if (HTTPAPIEX_Init() == HTTPAPIEX_ERROR)
    {
        LogError("HTTP for upload to blob failed on initialization.");
        result = MU_FAILURE;
    }
#endif /* DONT_USE_UPLOADTOBLOB */
#endif /* USE_HTTP */
#ifdef USE_OPENSSL
    if (result == 0)
    {
        result = tlsio_openssl_init();
    }
#elif USE_WOLFSSL
    if (result == 0)
    {
        result = tlsio_wolfssl_init();
    }
#endif
    return result;
}